

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O0

real_t __thiscall
xLearn::LinearScore::CalcScore(LinearScore *this,SparseRow *row,Model *model,real_t norm)

{
  undefined1 auVar1 [16];
  bool bVar2;
  pointer pNVar3;
  real_t *prVar4;
  Model *in_RDX;
  undefined1 auVar5 [64];
  index_t idx;
  index_t feat_id;
  const_iterator iter;
  index_t auxiliary_size;
  real_t score;
  index_t num_feat;
  real_t *w;
  undefined4 in_stack_ffffffffffffffa8;
  real_t in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_40;
  int local_34;
  float local_30;
  index_t local_2c;
  real_t *local_28;
  Model *local_18;
  undefined1 extraout_var [60];
  
  local_18 = in_RDX;
  local_28 = Model::GetParameter_w(in_RDX);
  local_2c = Model::GetNumFeature(local_18);
  local_30 = 0.0;
  auVar5._0_4_ = Model::GetAuxiliarySize(local_18);
  auVar5._4_60_ = extraout_var;
  local_34 = vcvttss2usi_avx512f(auVar5._0_16_);
  local_40._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar2) break;
    pNVar3 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_40);
    in_stack_ffffffffffffffb4 = *(uint *)(pNVar3 + 4);
    if (in_stack_ffffffffffffffb4 < local_2c) {
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb4 * local_34;
      in_stack_ffffffffffffffac = local_28[in_stack_ffffffffffffffb0];
      pNVar3 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_40);
      auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(pNVar3 + 8)),
                               ZEXT416((uint)in_stack_ffffffffffffffac),ZEXT416((uint)local_30));
      local_30 = auVar1._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_40);
  }
  prVar4 = Model::GetParameter_b(local_18);
  return *prVar4 + local_30;
}

Assistant:

real_t LinearScore::CalcScore(const SparseRow* row,
                              Model& model,
                              real_t norm) {
  real_t* w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  real_t score = 0.0;
  index_t auxiliary_size = model.GetAuxiliarySize();
  // linear term
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (feat_id >= num_feat) continue;
    index_t idx = feat_id * auxiliary_size;
    score += w[idx] * iter->feat_val;
  }
  // bias
  score += model.GetParameter_b()[0];
  return score;
}